

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

uint16_t handleQuantizeEqualSig
                   (uint16_t abssrc,uint16_t npow2,uint16_t mask,float errTol,float srcFloat,
                   int doprint)

{
  ushort src;
  ushort uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  ushort in_DX;
  ushort in_SI;
  ushort in_DI;
  float in_XMM0_Da;
  float fVar4;
  float in_XMM1_Da;
  float delta1_2;
  float delta1_1;
  int bits1;
  int bits0;
  int srcbits;
  int bits1_1;
  float delta1;
  uint16_t mask2;
  float delta0;
  uint16_t alt1;
  uint16_t alt0;
  float local_1c;
  uint16_t local_16;
  
  local_16 = in_DI & in_DX;
  src = in_DI + in_SI & in_DX;
  if (in_ECX != 0) {
    printf("  test0  0x%04X %016b\n",(ulong)local_16,(ulong)local_16);
    printf("  test1  0x%04X %016b\n",(ulong)src,(ulong)src);
  }
  local_1c = imath_half_to_float(local_16);
  local_1c = in_XMM1_Da - local_1c;
  if (in_XMM0_Da <= local_1c) {
    uVar1 = in_DX ^ (in_SI | (ushort)((int)(uint)in_SI >> 1));
    local_16 = in_DI & uVar1;
    local_1c = imath_half_to_float(local_16);
    local_1c = in_XMM1_Da - local_1c;
    if (in_ECX != 0) {
      printf("  mask2  0x%04X %016b\n",(ulong)uVar1,(ulong)uVar1);
      printf("  test2  0x%04X %016b\n",(ulong)local_16,(ulong)local_16);
    }
    if (in_XMM0_Da <= local_1c) {
      fVar4 = imath_half_to_float(src);
      if (fVar4 - in_XMM1_Da < in_XMM0_Da) {
        iVar2 = countSetBits(src);
        iVar3 = countSetBits(in_DI);
        if (iVar2 < iVar3) {
          return src;
        }
      }
      return in_DI;
    }
  }
  iVar2 = countSetBits(local_16);
  iVar3 = countSetBits(src);
  if (iVar3 < iVar2) {
    fVar4 = imath_half_to_float(src);
    if (fVar4 - in_XMM1_Da < in_XMM0_Da) {
      return src;
    }
  }
  else if ((iVar3 == iVar2) && (fVar4 = imath_half_to_float(src), fVar4 - in_XMM1_Da < local_1c)) {
    return src;
  }
  return local_16;
}

Assistant:

static inline uint16_t handleQuantizeEqualSig (
    uint16_t abssrc, uint16_t npow2, uint16_t mask, float errTol, float srcFloat, int doprint)
{
    // 99.99% of the time, mask is the best choice but for a very few
    // 16-bit float to 32-bit float where even though the significands
    // of the shifted tolerance we will need mask2, so have a
    // different implementation than the basic choose 2 of the larger
    // / smaller cases
    uint16_t alt0 = (abssrc & mask);
    uint16_t alt1 = ((abssrc + npow2) & mask);

    if (doprint)
    {
        printf ("  test0  0x%04X %016b\n", alt0, alt0);
        printf ("  test1  0x%04X %016b\n", alt1, alt1);
    }

    // this costs us not much extra if it works (99.99% of the
    // time) as we would compute this immediately assuming
    // the mask almost always makes the bits smaller...
    float delta0 = srcFloat - imath_half_to_float(alt0);
    if (delta0 >= errTol)
    {
        const uint16_t mask2 = (mask ^ (npow2 | (npow2 >> 1)));

        alt0 = (abssrc & mask2);
        delta0 = srcFloat - imath_half_to_float(alt0);

        if (doprint)
        {
            printf ("  mask2  0x%04X %016b\n", mask2, mask2);
            printf ("  test2  0x%04X %016b\n", alt0, alt0);
        }

        // avoid a re-check against the tolerance below...
        if (delta0 >= errTol)
        {
            float delta1 = imath_half_to_float(alt1) - srcFloat;
            if (delta1 < errTol)
            {
                int bits1 = countSetBits (alt1);
                int srcbits = countSetBits (abssrc);
                if (bits1 < srcbits)
                    return alt1;
            }
            return abssrc;
        }
    }

    int bits0 = countSetBits (alt0);
    int bits1 = countSetBits (alt1);

    // bits0 is either the same as src (i.e. mask didn't mask any bits)
    // or smaller than src, so do not need to check against that
    //
    // bits1 because we add npow2 may not actually end up smaller...
    if (bits1 < bits0)
    {
        float delta1 = imath_half_to_float(alt1) - srcFloat;
        // bits1 < bits0 and if ok, just return
        if (delta1 < errTol)
            return alt1;
    }
    else if (bits1 == bits0)
    {
        float delta1 = imath_half_to_float(alt1) - srcFloat;
        if (delta1 < delta0)
            return alt1;
    }

    // bits0 < bits1 and ok
    return alt0;
}